

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

void console_init(int _osc_port)

{
  long lVar1;
  ulong uVar2;
  streambuf *old_cerr;
  streambuf *old_cout;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  int local_c [2];
  int _osc_port_local;
  
  local_c[0] = _osc_port;
  if (0 < _osc_port) {
    vera::toString<int>(&local_70,local_c);
    std::operator+(&local_50,"osc://localhost:",&local_70);
    std::operator+(&local_30,&local_50," ");
    std::__cxx11::string::operator=((string *)&cmd_prompt_abi_cxx11_,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  initscr();
  uVar2 = has_colors();
  if ((uVar2 & 1) != 0) {
    start_color();
    use_default_colors();
    init_pair(1,7,0xffffffff);
    init_pair(2,1,0xffffffff);
    init_pair(3,6,0xffffffff);
    have_colors = true;
  }
  cmd_win = (WINDOW *)newwin(3,_COLS,0);
  out_win = (WINDOW *)newwin(_LINES + -3,_COLS,3,0);
  stt_win = (WINDOW *)newwin(_LINES,stt_width,0,_COLS - stt_width);
  raw();
  cbreak();
  cbreak();
  noecho();
  scrollok(out_win,1);
  idlok(out_win,0);
  keypad(_stdscr,1);
  lVar1 = *(long *)(std::cout + -0x18);
  std::__cxx11::stringstream::rdbuf();
  std::ios::rdbuf((streambuf *)((long)&std::cout + lVar1));
  lVar1 = *(long *)(std::cerr + -0x18);
  std::__cxx11::stringstream::rdbuf();
  std::ios::rdbuf((streambuf *)((long)&std::cerr + lVar1));
  console_refresh();
  return;
}

Assistant:

void console_init(int _osc_port) {

    #if defined(SUPPORT_NCURSES)

    if (_osc_port > 0)
        cmd_prompt = "osc://localhost:" + vera::toString(_osc_port) + " ";

    initscr();
    if (has_colors()) {
        start_color();
        use_default_colors();

        // init_color(COLOR_MAGENTA, 1000, 100, 100);
        // init_color(COLOR_YELLOW, 800, 800, 800);
        // init_color(COLOR_GREEN, 600, 600, 600);
        // init_color(COLOR_BLUE, 400, 400, 400);
        // init_pair(1, COLOR_WHITE, -1);
        // init_pair(2, COLOR_YELLOW, -1);
        // init_pair(3, COLOR_MAGENTA, -1);
        // init_pair(4, COLOR_GREEN, -1);
        // init_pair(5, COLOR_BLUE, -1);

        init_pair(1, COLOR_WHITE, -1);
        init_pair(2, COLOR_RED, -1);
        init_pair(3, COLOR_CYAN, -1);

        have_colors = true;
    }

    // Create windows
    cmd_win = newwin(3, COLS, 0, 0);
    out_win = newwin(LINES-3, COLS, 3, 0);
    stt_win = newwin(LINES, stt_width, 0, COLS - stt_width);

    raw();
    crmode();
    cbreak();
    noecho();
    scrollok(out_win, true);
    idlok(out_win, false);

    //  // mouse capture
    // captureMouse(true);

    // Capture Keys
    keypad(stdscr, true);

    // Capture all standard console OUT and ERR
    std::streambuf * old_cout = std::cout.rdbuf(buffer_cout.rdbuf());
    std::streambuf * old_cerr = std::cerr.rdbuf(buffer_cerr.rdbuf());

    console_refresh();
    #endif
}